

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall
CVmObjGramProd::insert_alt(CVmObjGramProd *this,vm_obj_id_t self,size_t idx,vmgram_alt_info *alt)

{
  vmgram_alt_info **ppvVar1;
  vm_gram_ext *pvVar2;
  vmgram_alt_info *in_RCX;
  ulong in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjGramProd *in_RDI;
  CVmObjGramProd *unaff_retaddr;
  size_t i;
  vmgram_alt_info **alts;
  ulong local_30;
  undefined4 in_stack_fffffffffffffff0;
  CVmObjGramProd *cnt;
  
  cnt = in_RDI;
  get_ext(in_RDI);
  ensure_alts(unaff_retaddr,(size_t)cnt,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  pvVar2 = get_ext(in_RDI);
  ppvVar1 = pvVar2->alts_;
  pvVar2 = get_ext(in_RDI);
  for (local_30 = pvVar2->alt_cnt_; in_RDX < local_30; local_30 = local_30 - 1) {
    ppvVar1[local_30] = ppvVar1[local_30 - 1];
  }
  pvVar2 = get_ext(in_RDI);
  pvVar2->alt_cnt_ = pvVar2->alt_cnt_ + 1;
  ppvVar1[in_RDX] = in_RCX;
  pvVar2 = get_ext(in_RDI);
  pvVar2->field_0x14 = pvVar2->field_0x14 & 0xfe | 1;
  if (((in_RCX->tok_cnt != 0) && (in_RCX->toks->typ == '\x01')) &&
     ((in_RCX->toks->typinfo).prod_obj == in_ESI)) {
    pvVar2 = get_ext(in_RDI);
    pvVar2->field_0x14 = pvVar2->field_0x14 & 0xfb | 4;
  }
  return;
}

Assistant:

void CVmObjGramProd::insert_alt(
    vm_obj_id_t self, size_t idx, vmgram_alt_info *alt)
{
    /* make sure we have room for one more alternative */
    ensure_alts(get_ext()->alt_cnt_ + 1, 8);

    /* get the alt list */
    vmgram_alt_info **alts = get_ext()->alts_;

    /* open a hole in the array for the new alternative */
    for (size_t i = get_ext()->alt_cnt_ ; i > idx ; --i)
        alts[i] = alts[i-1];

    /* adjust the count */
    get_ext()->alt_cnt_ += 1;

    /* plug in the new alternative */
    alts[idx] = alt;

    /* we've been modified since load time */
    get_ext()->modified_ = TRUE;

    /* note if this adds a circular rule */
    if (alt->tok_cnt != 0
        && alt->toks->typ == VMGRAM_MATCH_PROD
        && alt->toks->typinfo.prod_obj == self)
        get_ext()->has_circular_alt = TRUE;
}